

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

int KINStop(KINMem kin_mem,int maxStepTaken,int sflag)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  KINMem kin_mem_00;
  sunrealtype sVar1;
  double dVar2;
  double dVar3;
  N_Vector delta;
  sunrealtype omexp;
  sunrealtype rlength;
  sunrealtype fmax;
  N_Vector in_stack_ffffffffffffff98;
  KINMem in_stack_ffffffffffffffa0;
  N_Vector in_stack_ffffffffffffffa8;
  KINMem in_stack_ffffffffffffffb0;
  double local_48;
  double local_40;
  int local_4;
  
  if (in_EDX == -0x3e5) {
    if ((*(long *)(in_RDI + 0x238) == 0) || (*(int *)(in_RDI + 100) != 0)) {
      if (*(int *)(in_RDI + 0x30) == 0) {
        local_4 = 2;
      }
      else {
        local_4 = -5;
      }
    }
    else {
      *(undefined8 *)(in_RDI + 200) = 0x4000000000000000;
      local_4 = -0x3e6;
    }
  }
  else {
    kin_mem_00 = (KINMem)KINScFNorm(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                    (N_Vector)0x10ec9e);
    KINPrintInfo(kin_mem_00,(int)in_RDI,(char *)0x4,"KINSOL","KINStop",
                 "scaled f norm (for stopping) = %12.3lg");
    if (*(double *)(in_RDI + 0x20) < (double)kin_mem_00) {
      N_VLinearSum(0x3ff0000000000000,&DAT_bff0000000000000,*(undefined8 *)(in_RDI + 0x110),
                   *(undefined8 *)(in_RDI + 0x108),*(undefined8 *)(in_RDI + 0x138));
      sVar1 = KINScSNorm(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                         (N_Vector)in_stack_ffffffffffffffa0);
      if (*(double *)(in_RDI + 0x28) < sVar1) {
        if (*(long *)(in_RDI + 0xd0) < *(long *)(in_RDI + 0x38)) {
          if (in_ESI == 0) {
            *(undefined8 *)(in_RDI + 0x100) = 0;
          }
          else {
            *(long *)(in_RDI + 0x100) = *(long *)(in_RDI + 0x100) + 1;
          }
          if (*(long *)(in_RDI + 0x100) == 5) {
            local_4 = -7;
          }
          else {
            if (*(int *)(in_RDI + 0x250) == 0) {
              if (*(int *)(in_RDI + 0x6c) == 0) {
                if (*(long *)(in_RDI + 0xd0) - *(long *)(in_RDI + 0xe8) < *(long *)(in_RDI + 0x48))
                {
                  if ((*(int *)(in_RDI + 0x70) != 0) || (*(int *)(in_RDI + 0x74) != 0)) {
                    *(undefined8 *)(in_RDI + 0x280) = *(undefined8 *)(in_RDI + 0x260);
                  }
                  if (*(int *)(in_RDI + 0x74) != 0) {
                    *(undefined4 *)(in_RDI + 0x74) = 0;
                  }
                  *(undefined8 *)(in_RDI + 200) = 0x3ff0000000000000;
                }
                else {
                  *(undefined8 *)(in_RDI + 0xe8) = *(undefined8 *)(in_RDI + 0xd0);
                  if (*(int *)(in_RDI + 0x288) != 0) {
                    if (0.0 <= *(double *)(in_RDI + 0x260) / *(double *)(in_RDI + 0x20) - 1.0) {
                      local_40 = *(double *)(in_RDI + 0x260) / *(double *)(in_RDI + 0x20) - 1.0;
                    }
                    else {
                      local_40 = 0.0;
                    }
                    if (local_40 <= 12.0) {
                      dVar3 = *(double *)(in_RDI + 0x298);
                      dVar2 = exp(local_40);
                      if (*(double *)(in_RDI + 0x2a0) <= dVar3 * dVar2) {
                        local_48 = *(double *)(in_RDI + 0x2a0);
                      }
                      else {
                        local_48 = *(double *)(in_RDI + 0x298);
                        dVar3 = exp(local_40);
                        local_48 = local_48 * dVar3;
                      }
                    }
                    else {
                      local_48 = *(double *)(in_RDI + 0x2a0);
                    }
                    *(double *)(in_RDI + 0x290) = local_48;
                  }
                  if (*(double *)(in_RDI + 0x260) <=
                      *(double *)(in_RDI + 0x290) * *(double *)(in_RDI + 0x280)) {
                    *(undefined8 *)(in_RDI + 0x280) = *(undefined8 *)(in_RDI + 0x260);
                    *(undefined8 *)(in_RDI + 200) = 0x3ff0000000000000;
                  }
                  else if ((*(long *)(in_RDI + 0x238) != 0) && (*(int *)(in_RDI + 100) == 0)) {
                    *(undefined8 *)(in_RDI + 200) = 0x4000000000000000;
                    return -999;
                  }
                }
              }
            }
            else {
              *(sunrealtype *)(in_RDI + 200) = sVar1;
            }
            local_4 = -999;
          }
        }
        else {
          local_4 = -6;
        }
      }
      else if ((*(long *)(in_RDI + 0x238) == 0) || (*(int *)(in_RDI + 100) != 0)) {
        local_4 = 2;
      }
      else {
        *(undefined8 *)(in_RDI + 200) = 0x4000000000000000;
        local_4 = -999;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int KINStop(KINMem kin_mem, sunbooleantype maxStepTaken, int sflag)
{
  sunrealtype fmax, rlength, omexp;
  N_Vector delta;

  /* Check for too small a step */

  if (sflag == STEP_TOO_SMALL)
  {
    if ((kin_mem->kin_lsetup != NULL) && !(kin_mem->kin_jacCurrent))
    {
      /* If the Jacobian is out of date, update it and retry */
      kin_mem->kin_sthrsh = TWO;
      return (RETRY_ITERATION);
    }
    else
    {
      /* Give up */
      if (kin_mem->kin_globalstrategy == KIN_NONE)
      {
        return (KIN_STEP_LT_STPTOL);
      }
      else { return (KIN_LINESEARCH_NONCONV); }
    }
  }

  /* Check tolerance on scaled function norm at the current iterate */

  fmax = KINScFNorm(kin_mem, kin_mem->kin_fval, kin_mem->kin_fscale);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
  KINPrintInfo(kin_mem, PRNT_FMAX, "KINSOL", __func__, INFO_FMAX, fmax);
#endif

  if (fmax <= kin_mem->kin_fnormtol) { return (KIN_SUCCESS); }

  /* Check if the scaled distance between the last two steps is too small */
  /* NOTE: pp used as work space to store this distance */

  delta = kin_mem->kin_pp;
  N_VLinearSum(ONE, kin_mem->kin_unew, -ONE, kin_mem->kin_uu, delta);
  rlength = KINScSNorm(kin_mem, delta, kin_mem->kin_unew);

  if (rlength <= kin_mem->kin_scsteptol)
  {
    if ((kin_mem->kin_lsetup != NULL) && !(kin_mem->kin_jacCurrent))
    {
      /* If the Jacobian is out of date, update it and retry */
      kin_mem->kin_sthrsh = TWO;
      return (CONTINUE_ITERATIONS);
    }
    else
    {
      /* give up */
      return (KIN_STEP_LT_STPTOL);
    }
  }

  /* Check if the maximum number of iterations is reached */

  if (kin_mem->kin_nni >= kin_mem->kin_mxiter) { return (KIN_MAXITER_REACHED); }

  /* Check for consecutive number of steps taken of size mxnewtstep
     and if not maxStepTaken, then set ncscmx to 0 */

  if (maxStepTaken) { kin_mem->kin_ncscmx++; }
  else { kin_mem->kin_ncscmx = 0; }

  if (kin_mem->kin_ncscmx == 5) { return (KIN_MXNEWT_5X_EXCEEDED); }

  /* Proceed according to the type of linear solver used */

  if (kin_mem->kin_inexact_ls)
  {
    /* We're doing inexact Newton.
       Load threshold for reevaluating the Jacobian. */

    kin_mem->kin_sthrsh = rlength;
  }
  else if (!(kin_mem->kin_noResMon))
  {
    /* We're doing modified Newton and the user did not disable residual monitoring.
       Check if it is time to monitor residual. */

    if ((kin_mem->kin_nni - kin_mem->kin_nnilset_sub) >= kin_mem->kin_msbset_sub)
    {
      /* Residual monitoring needed */

      kin_mem->kin_nnilset_sub = kin_mem->kin_nni;

      /* If indicated, estimate new OMEGA value */
      if (kin_mem->kin_eval_omega)
      {
        omexp              = SUNMAX(ZERO,
                                    ((kin_mem->kin_fnorm) / (kin_mem->kin_fnormtol)) - ONE);
        kin_mem->kin_omega = (omexp > TWELVE)
                               ? kin_mem->kin_omega_max
                               : SUNMIN(kin_mem->kin_omega_min * SUNRexp(omexp),
                                        kin_mem->kin_omega_max);
      }
      /* Check if making satisfactory progress */

      if (kin_mem->kin_fnorm > kin_mem->kin_omega * kin_mem->kin_fnorm_sub)
      {
        /* Insufficient progress */
        if ((kin_mem->kin_lsetup != NULL) && !(kin_mem->kin_jacCurrent))
        {
          /* If the Jacobian is out of date, update it and retry */
          kin_mem->kin_sthrsh = TWO;
          return (CONTINUE_ITERATIONS);
        }
        else
        { /* Otherwise, we cannot do anything, so just return. */
        }
      }
      else
      {
        /* Sufficient progress */
        kin_mem->kin_fnorm_sub = kin_mem->kin_fnorm;
        kin_mem->kin_sthrsh    = ONE;
      }
    }
    else
    {
      /* Residual monitoring not needed */

      /* Reset sthrsh */
      if (kin_mem->kin_retry_nni || kin_mem->kin_update_fnorm_sub)
      {
        kin_mem->kin_fnorm_sub = kin_mem->kin_fnorm;
      }
      if (kin_mem->kin_update_fnorm_sub)
      {
        kin_mem->kin_update_fnorm_sub = SUNFALSE;
      }
      kin_mem->kin_sthrsh = ONE;
    }
  }

  /* if made it to here, then the iteration process is not finished
     so return CONTINUE_ITERATIONS flag */

  return (CONTINUE_ITERATIONS);
}